

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void deqp::gles3::Functional::FboTestUtil::readPixels
               (Context *ctx,Surface *dst,int x,int y,int width,int height,TextureFormat *format,
               Vec4 *scale,Vec4 *bias)

{
  int iVar1;
  TransferFormat TVar2;
  uint rowPitch;
  int y_00;
  void *data_00;
  Vec4 local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  TextureFormat readFormat;
  undefined1 local_98 [24];
  ConstPixelBufferAccess src;
  PixelBufferAccess dstAccess;
  
  readFormat = getFramebufferReadFormat(format);
  TVar2 = glu::getTransferFormat(readFormat);
  iVar1 = tcu::TextureFormat::getPixelSize(&readFormat);
  rowPitch = iVar1 * width + 3U & 0xfffffffc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(long)(int)(rowPitch * height),(allocator_type *)&src);
  (*ctx->_vptr_Context[0x78])
            (ctx,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)width,(ulong)(uint)height,
             (ulong)TVar2 & 0xffffffff,(ulong)TVar2 >> 0x20,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&src,&readFormat,width,height,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::Surface::setSize(dst,width,height);
  local_c8.m_data[0] = 1.12104e-44;
  local_c8.m_data[1] = 4.2039e-45;
  data_00 = (void *)(dst->m_pixels).m_cap;
  if (data_00 != (void *)0x0) {
    data_00 = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&dstAccess,(TextureFormat *)&local_c8,dst->m_width,dst->m_height,1,data_00);
  if (0 < height) {
    iVar1 = 0;
    do {
      if (0 < width) {
        y_00 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_98,(int)&src,y_00,iVar1);
          local_c8.m_data[1] = bias->m_data[1] + scale->m_data[1] * (float)local_98._4_4_;
          local_c8.m_data[0] = bias->m_data[0] + scale->m_data[0] * (float)local_98._0_4_;
          local_c8.m_data[3] = bias->m_data[3] + scale->m_data[3] * (float)local_98._12_4_;
          local_c8.m_data[2] = bias->m_data[2] + scale->m_data[2] * (float)local_98._8_4_;
          tcu::PixelBufferAccess::setPixel(&dstAccess,&local_c8,y_00,iVar1,0);
          y_00 = y_00 + 1;
        } while (width != y_00);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 != height);
  }
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void readPixels (sglr::Context& ctx, tcu::Surface& dst, int x, int y, int width, int height, const tcu::TextureFormat& format, const tcu::Vec4& scale, const tcu::Vec4& bias)
{
	tcu::TextureFormat		readFormat		= getFramebufferReadFormat(format);
	glu::TransferFormat		transferFmt		= glu::getTransferFormat(readFormat);
	int						alignment		= 4; // \note GL_PACK_ALIGNMENT = 4 is assumed.
	int						rowSize			= deAlign32(readFormat.getPixelSize()*width, alignment);
	vector<deUint8>			data			(rowSize*height);

	ctx.readPixels(x, y, width, height, transferFmt.format, transferFmt.dataType, &data[0]);

	// Convert to surface.
	tcu::ConstPixelBufferAccess src(readFormat, width, height, 1, rowSize, 0, &data[0]);

	dst.setSize(width, height);
	tcu::PixelBufferAccess dstAccess = dst.getAccess();

	for (int yo = 0; yo < height; yo++)
	for (int xo = 0; xo < width; xo++)
		dstAccess.setPixel(src.getPixel(xo, yo) * scale + bias, xo, yo);
}